

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

void __thiscall
leveldb::InternalKeyComparator::FindShortestSeparator
          (InternalKeyComparator *this,string *start,Slice *limit)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  string *in_RSI;
  long in_RDI;
  bool bVar5;
  string tmp;
  Slice user_limit;
  Slice user_start;
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  undefined1 local_80 [23];
  allocator local_69;
  string local_68 [32];
  Slice local_48 [2];
  Slice local_28;
  string *local_10;
  
  local_10 = in_RSI;
  Slice::Slice((Slice *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_28 = ExtractUserKey((Slice *)in_stack_ffffffffffffff50);
  local_48[0] = ExtractUserKey((Slice *)in_stack_ffffffffffffff50);
  pcVar2 = Slice::data(&local_28);
  sVar3 = Slice::size(&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,pcVar2,sVar3,&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  (**(code **)(**(long **)(in_RDI + 8) + 0x20))(*(long **)(in_RDI + 8),local_68,local_48);
  uVar4 = std::__cxx11::string::size();
  sVar3 = Slice::size(&local_28);
  bVar5 = false;
  if (uVar4 < sVar3) {
    in_stack_ffffffffffffff50 = *(string **)(in_RDI + 8);
    Slice::Slice((Slice *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    iVar1 = (**(code **)(*(long *)in_stack_ffffffffffffff50 + 0x10))
                      (in_stack_ffffffffffffff50,&local_28,local_80);
    bVar5 = iVar1 < 0;
  }
  if (bVar5) {
    PackSequenceAndType(0xffffffffffffff,kTypeValue);
    PutFixed64(in_stack_ffffffffffffff50,(uint64_t)in_stack_ffffffffffffff48);
    std::__cxx11::string::swap(local_10);
  }
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

void InternalKeyComparator::FindShortestSeparator(std::string* start,
                                                  const Slice& limit) const {
  // Attempt to shorten the user portion of the key
  Slice user_start = ExtractUserKey(*start);
  Slice user_limit = ExtractUserKey(limit);
  std::string tmp(user_start.data(), user_start.size());
  user_comparator_->FindShortestSeparator(&tmp, user_limit);
  if (tmp.size() < user_start.size() &&
      user_comparator_->Compare(user_start, tmp) < 0) {
    // User key has become shorter physically, but larger logically.
    // Tack on the earliest possible number to the shortened user key.
    PutFixed64(&tmp,
               PackSequenceAndType(kMaxSequenceNumber, kValueTypeForSeek));
    assert(this->Compare(*start, tmp) < 0);
    assert(this->Compare(tmp, limit) < 0);
    start->swap(tmp);
  }
}